

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_sign_recoverable
              (secp256k1_context *ctx,secp256k1_ecdsa_recoverable_signature *signature,
              uchar *msghash32,uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  secp256k1_ecmult_gen_context *in_RDI;
  undefined8 in_R8;
  int recid_00;
  secp256k1_scalar *in_R9;
  uchar *unaff_retaddr;
  int *in_stack_00000008;
  int recid;
  int ret;
  secp256k1_scalar s;
  secp256k1_scalar r;
  char *in_stack_ffffffffffffffa8;
  secp256k1_callback *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  secp256k1_ecdsa_recoverable_signature *in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  recid_00 = (int)((ulong)in_R8 >> 0x20);
  if (in_RDI == (secp256k1_ecmult_gen_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/modules/recovery/main_impl.h"
            ,0x7e,"test condition failed: ctx != NULL");
    abort();
  }
  iVar1 = secp256k1_ecmult_gen_context_is_built(in_RDI);
  if (iVar1 == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    iVar1 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    iVar1 = 0;
  }
  else if (in_RSI == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    iVar1 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    iVar1 = 0;
  }
  else {
    iVar1 = secp256k1_ecdsa_sign_inner
                      ((secp256k1_context *)noncedata,_s,_recid,in_stack_00000008,unaff_retaddr,
                       (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (secp256k1_nonce_function)seckey,msghash32);
    secp256k1_ecdsa_recoverable_signature_save
              (in_stack_ffffffffffffffc0,
               (secp256k1_scalar *)CONCAT44(iVar1,in_stack_ffffffffffffffb8),in_R9,recid_00);
  }
  return iVar1;
}

Assistant:

int secp256k1_ecdsa_sign_recoverable(const secp256k1_context* ctx, secp256k1_ecdsa_recoverable_signature *signature, const unsigned char *msghash32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    int ret, recid;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, &recid, msghash32, seckey, noncefp, noncedata);
    secp256k1_ecdsa_recoverable_signature_save(signature, &r, &s, recid);
    return ret;
}